

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O0

void Abc_NtkSplitLarge(Abc_Ntk_t *pNtk,int nFaninsMax,int nCubesMax)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Abc_Obj_t *pObj;
  int local_28;
  int nCubes;
  int i;
  int nObjOld;
  Abc_Obj_t *pNode;
  int nCubesMax_local;
  int nFaninsMax_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkObjNumMax(pNtk);
  iVar2 = Abc_NtkHasSop(pNtk);
  if (iVar2 == 0) {
    __assert_fail("Abc_NtkHasSop(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFanOrder.c"
                  ,0x1a8,"void Abc_NtkSplitLarge(Abc_Ntk_t *, int, int)");
  }
  local_28 = 0;
  do {
    iVar2 = Vec_PtrSize(pNtk->vObjs);
    if (iVar2 <= local_28) {
      return;
    }
    pObj = Abc_NtkObj(pNtk,local_28);
    if ((pObj != (Abc_Obj_t *)0x0) && (iVar2 = Abc_ObjIsNode(pObj), iVar2 != 0)) {
      if (local_28 == iVar1) {
        return;
      }
      iVar2 = Abc_SopGetCubeNum((char *)(pObj->field_5).pData);
      iVar3 = Abc_ObjFaninNum(pObj);
      if (((nFaninsMax < iVar3) && (1 < iVar2)) || (nCubesMax < iVar2)) {
        Abc_NodeSplitLarge(pObj);
      }
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

void Abc_NtkSplitLarge( Abc_Ntk_t * pNtk, int nFaninsMax, int nCubesMax )
{
    Abc_Obj_t * pNode;
    int nObjOld = Abc_NtkObjNumMax(pNtk);
    int i, nCubes;
    assert( Abc_NtkHasSop(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( i == nObjOld )
            break;
        nCubes = Abc_SopGetCubeNum((char *)pNode->pData);
        if ( (Abc_ObjFaninNum(pNode) > nFaninsMax && nCubes > 1) || nCubes > nCubesMax )
            Abc_NodeSplitLarge( pNode );
    }
}